

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_4_dual_sse2
               (uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0,uchar *_blimit1,
               uchar *_limit1,uchar *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int6 iVar23;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  longlong in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  byte bVar24;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ulong uVar32;
  __m128i alVar33;
  __m128i b;
  __m128i a;
  __m128i a_00;
  __m128i t;
  __m128i thresh1;
  __m128i thresh0;
  __m128i l;
  __m128i limit;
  __m128i blimit;
  __m128i zero;
  __m128i ps1ps0;
  __m128i qs1qs0;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i abs_p1q1p0q0;
  __m128i flat;
  __m128i zero_1;
  __m128i hev;
  __m128i mask;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i q0p0;
  __m128i q1p1;
  __m128i ff;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  ulong local_ac8;
  ulong uStack_ac0;
  byte local_ab8;
  undefined1 uStack_ab7;
  undefined1 uStack_ab6;
  undefined1 uStack_ab5;
  undefined1 uStack_ab4;
  undefined1 uStack_ab3;
  undefined1 uStack_ab2;
  undefined1 uStack_ab1;
  byte bStack_ab0;
  undefined1 uStack_aaf;
  undefined1 uStack_aae;
  undefined1 uStack_aad;
  undefined1 uStack_aac;
  undefined1 uStack_aab;
  undefined1 uStack_aaa;
  undefined1 uStack_aa9;
  byte local_aa8;
  undefined1 uStack_aa7;
  undefined1 uStack_aa6;
  undefined1 uStack_aa5;
  undefined1 uStack_aa4;
  undefined1 uStack_aa3;
  undefined1 uStack_aa2;
  undefined1 uStack_aa1;
  byte bStack_aa0;
  undefined1 uStack_a9f;
  undefined1 uStack_a9e;
  undefined1 uStack_a9d;
  undefined1 uStack_a9c;
  undefined1 uStack_a9b;
  undefined1 uStack_a9a;
  undefined1 uStack_a99;
  undefined1 local_a98 [16];
  undefined4 local_a88;
  undefined4 uStack_a84;
  undefined4 uStack_a80;
  undefined4 uStack_a7c;
  undefined4 local_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined8 local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  undefined8 uStack_a50;
  ulong local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  ulong local_a28 [3];
  undefined8 uStack_a10;
  ulong local_a08 [6];
  int local_9d4;
  ulong *local_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_920;
  ulong local_918;
  undefined8 uStack_910;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 *local_8e0;
  ulong local_8d8;
  undefined8 uStack_8d0;
  ulong *local_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  ulong local_728;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined8 local_718;
  ulong uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  ulong local_6f8;
  undefined8 uStack_6f0;
  ulong *local_6e8;
  ulong *local_6e0;
  undefined8 *local_6d8;
  undefined1 (*local_6d0) [16];
  undefined8 *local_6c8;
  ulong *local_6c0;
  ulong *local_6b8;
  ulong *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  char local_698;
  char cStack_697;
  char cStack_696;
  char cStack_695;
  char cStack_694;
  char cStack_693;
  char cStack_692;
  char cStack_691;
  ulong local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  ulong uStack_640;
  ulong local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  ulong local_608;
  undefined8 uStack_600;
  char cStack_5f0;
  char cStack_5ef;
  char cStack_5ee;
  char cStack_5ed;
  char cStack_5ec;
  char cStack_5eb;
  char cStack_5ea;
  char cStack_5e9;
  char local_5e8;
  char cStack_5e7;
  char cStack_5e6;
  char cStack_5e5;
  char cStack_5e4;
  char cStack_5e3;
  char cStack_5e2;
  char cStack_5e1;
  char cStack_5e0;
  char cStack_5df;
  char cStack_5de;
  char cStack_5dd;
  char cStack_5dc;
  char cStack_5db;
  char cStack_5da;
  char cStack_5d9;
  byte local_5c8;
  byte bStack_5c7;
  byte bStack_5c6;
  byte bStack_5c5;
  byte bStack_5c4;
  byte bStack_5c3;
  byte bStack_5c2;
  byte bStack_5c1;
  byte bStack_5c0;
  byte bStack_5bf;
  byte bStack_5be;
  byte bStack_5bd;
  byte bStack_5bc;
  byte bStack_5bb;
  byte bStack_5ba;
  byte bStack_5b9;
  ushort uStack_566;
  ushort uStack_564;
  ushort uStack_562;
  ushort uStack_560;
  ushort uStack_55e;
  ushort uStack_55c;
  ushort uStack_55a;
  byte bStack_500;
  byte bStack_4ff;
  byte bStack_4fe;
  byte bStack_4fc;
  byte bStack_4fb;
  byte bStack_4fa;
  byte bStack_4f9;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short sStack_4f0;
  short sStack_4ee;
  short sStack_4ec;
  short sStack_4ea;
  short sStack_4e6;
  short sStack_4e4;
  short sStack_4e2;
  short sStack_4e0;
  short sStack_4de;
  short sStack_4dc;
  short sStack_4da;
  ulong local_498;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined1 local_478;
  undefined1 uStack_477;
  undefined1 uStack_476;
  undefined1 uStack_475;
  undefined8 local_468;
  undefined8 local_458;
  ulong uStack_450;
  undefined1 local_448 [16];
  ulong uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  ulong local_408;
  ulong uStack_400;
  ulong *local_3e8;
  undefined1 local_3a8;
  undefined1 uStack_3a7;
  undefined1 uStack_3a6;
  undefined1 uStack_3a5;
  undefined1 uStack_3a4;
  undefined1 uStack_3a3;
  undefined1 uStack_3a2;
  undefined1 uStack_3a1;
  undefined1 local_388;
  undefined1 uStack_387;
  undefined1 uStack_386;
  undefined1 uStack_385;
  undefined1 uStack_384;
  undefined1 uStack_383;
  undefined1 uStack_382;
  undefined1 uStack_381;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined4 uStack_20;
  undefined4 uStack_10;
  
  local_6d8 = &local_ac8;
  local_9d4 = (int)in_RSI;
  local_8c0 = (ulong *)((long)in_RDI - (long)(local_9d4 * 2));
  local_a08[0] = *local_8c0;
  uStack_8d0 = 0;
  local_a08[1] = 0;
  local_8e0 = (undefined8 *)((long)in_RDI - (long)local_9d4);
  local_a28[2] = *local_8e0;
  uStack_8f0 = 0;
  uStack_a10 = 0;
  local_a28[0] = *in_RDI;
  uStack_910 = 0;
  local_a28[1] = 0;
  b[1] = (long)local_9d4;
  local_920 = (undefined8 *)((long)in_RDI + b[1]);
  local_a38 = *local_920;
  uStack_930 = 0;
  uStack_a30 = 0;
  local_9c8 = 0;
  uStack_9c0 = 0;
  local_a68 = 0;
  uStack_a60 = 0;
  uVar1 = *in_RDX;
  uStack_980 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_990 = in_R9[1];
  local_988._0_4_ = (undefined4)uVar1;
  local_988._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_998._0_4_ = (undefined4)uVar2;
  local_998._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_a78 = (undefined4)local_988;
  uStack_a74 = (undefined4)local_998;
  uStack_a70 = local_988._4_4_;
  uStack_a6c = local_998._4_4_;
  uVar3 = *in_RCX;
  uStack_9a0 = in_RCX[1];
  uVar4 = *(undefined8 *)t[1];
  uStack_9b0 = *(undefined8 *)(t[1] + 8);
  local_9a8._0_4_ = (undefined4)uVar3;
  local_9a8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_9b8._0_4_ = (undefined4)uVar4;
  local_9b8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_a88 = (undefined4)local_9a8;
  uStack_a84 = (undefined4)local_9b8;
  uStack_a80 = local_9a8._4_4_;
  uStack_a7c = local_9b8._4_4_;
  local_a98._4_4_ = (undefined4)local_998;
  local_a98._0_4_ = (undefined4)local_988;
  uStack_7a0 = CONCAT44(local_998._4_4_,local_988._4_4_);
  local_a98._12_4_ = (undefined4)local_9b8;
  local_a98._8_4_ = (undefined4)local_9a8;
  uStack_7b0 = CONCAT44(local_9b8._4_4_,local_9a8._4_4_);
  local_958 = *in_R8;
  uStack_950 = 0;
  uStack_880 = 0;
  local_898 = 0;
  uStack_890 = 0;
  local_888._0_1_ = (byte)local_958;
  local_888._1_1_ = (undefined1)((ulong)local_958 >> 8);
  local_888._2_1_ = (undefined1)((ulong)local_958 >> 0x10);
  local_888._3_1_ = (undefined1)((ulong)local_958 >> 0x18);
  local_888._4_1_ = (byte)((ulong)local_958 >> 0x20);
  local_888._5_1_ = (undefined1)((ulong)local_958 >> 0x28);
  local_888._6_1_ = (undefined1)((ulong)local_958 >> 0x30);
  local_888._7_1_ = (undefined1)((ulong)local_958 >> 0x38);
  local_aa8 = (byte)local_888;
  uStack_aa7 = 0;
  uStack_aa6 = local_888._1_1_;
  uStack_aa5 = 0;
  uStack_aa4 = local_888._2_1_;
  uStack_aa3 = 0;
  uStack_aa2 = local_888._3_1_;
  uStack_aa1 = 0;
  bStack_aa0 = local_888._4_1_;
  uStack_a9f = 0;
  uStack_a9e = local_888._5_1_;
  uStack_a9d = 0;
  uStack_a9c = local_888._6_1_;
  uStack_a9b = 0;
  uStack_a9a = local_888._7_1_;
  uStack_a99 = 0;
  local_978 = *(undefined8 *)thresh1[0];
  uStack_970 = 0;
  uStack_8a0 = 0;
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_8a8._0_1_ = (byte)local_978;
  local_8a8._1_1_ = (undefined1)((ulong)local_978 >> 8);
  local_8a8._2_1_ = (undefined1)((ulong)local_978 >> 0x10);
  local_8a8._3_1_ = (undefined1)((ulong)local_978 >> 0x18);
  local_8a8._4_1_ = (byte)((ulong)local_978 >> 0x20);
  local_8a8._5_1_ = (undefined1)((ulong)local_978 >> 0x28);
  local_8a8._6_1_ = (undefined1)((ulong)local_978 >> 0x30);
  local_8a8._7_1_ = (undefined1)((ulong)local_978 >> 0x38);
  local_ab8 = (byte)local_8a8;
  uStack_ab7 = 0;
  uStack_ab6 = local_8a8._1_1_;
  uStack_ab5 = 0;
  uStack_ab4 = local_8a8._2_1_;
  uStack_ab3 = 0;
  uStack_ab2 = local_8a8._3_1_;
  uStack_ab1 = 0;
  bStack_ab0 = local_8a8._4_1_;
  uStack_aaf = 0;
  uStack_aae = local_8a8._5_1_;
  uStack_aad = 0;
  uStack_aac = local_8a8._6_1_;
  uStack_aab = 0;
  uStack_aaa = local_8a8._7_1_;
  uStack_aa9 = 0;
  local_ac8 = (ulong)CONCAT16(local_888._3_1_,
                              (uint6)CONCAT14(local_888._2_1_,
                                              (uint)CONCAT12(local_888._1_1_,(ushort)(byte)local_888
                                                            )));
  uStack_7c0 = (ulong)CONCAT16(local_888._7_1_,
                               (uint6)CONCAT14(local_888._6_1_,
                                               (uint)CONCAT12(local_888._5_1_,
                                                              (ushort)local_888._4_1_)));
  uStack_ac0 = (ulong)CONCAT16(local_8a8._3_1_,
                               (uint6)CONCAT14(local_8a8._2_1_,
                                               (uint)CONCAT12(local_8a8._1_1_,
                                                              (ushort)(byte)local_8a8)));
  uStack_7d0 = (ulong)CONCAT16(local_8a8._7_1_,
                               (uint6)CONCAT14(local_8a8._6_1_,
                                               (uint)CONCAT12(local_8a8._5_1_,
                                                              (ushort)local_8a8._4_1_)));
  local_6b0 = local_a08;
  local_6b8 = local_a28 + 2;
  local_6c0 = local_a28;
  local_6c8 = &local_a38;
  local_6d0 = &local_a98;
  local_6e0 = &local_a48;
  local_6e8 = &local_a58;
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_778 = 0;
  uStack_770 = 0;
  uStack_600 = 0;
  uStack_610 = 0;
  uStack_620 = 0;
  uStack_630 = 0;
  uStack_700._4_4_ = (undefined4)(local_a28[0] >> 0x20);
  uStack_6f0._4_4_ = (undefined4)((ulong)local_a38 >> 0x20);
  uStack_47c = uStack_700._4_4_;
  local_478 = (undefined1)local_a08[0];
  uStack_477 = (undefined1)(local_a08[0] >> 8);
  uStack_476 = (undefined1)(local_a08[0] >> 0x10);
  uStack_475 = (undefined1)(local_a08[0] >> 0x18);
  uStack_48c = uStack_6f0._4_4_;
  _local_488 = CONCAT44((int)(local_a28[2] >> 0x20),local_6e8._0_4_);
  uStack_720 = uStack_480;
  uStack_71c = uStack_700._4_4_;
  local_718 = CONCAT44(uStack_6f0._4_4_,uStack_490);
  b[0] = (longlong)in_RDX;
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  local_9d0 = in_RDI;
  local_9b8 = uVar4;
  local_9a8 = uVar3;
  local_998 = uVar2;
  local_988 = uVar1;
  local_938 = local_a38;
  local_918 = local_a28[0];
  local_8f8 = local_a28[2];
  local_8d8 = local_a08[0];
  local_8a8 = local_978;
  local_888 = local_958;
  local_7d8 = uStack_ac0;
  local_7c8 = local_ac8;
  local_7b8 = local_a98._8_8_;
  local_7a8 = local_a98._0_8_;
  uStack_710 = local_a08[0];
  local_708 = local_a28[2];
  uStack_700 = local_a28[0];
  local_6f8 = local_a08[0];
  uStack_6f0 = local_a38;
  local_658 = local_a08[0];
  uStack_650 = local_a38;
  local_648 = local_a28[2];
  uStack_640 = local_a28[0];
  local_638 = local_a28[0];
  local_628 = local_a28[2];
  local_618 = local_a38;
  local_608 = local_a08[0];
  local_498 = local_a08[0];
  alVar33 = abs_diff(a,b);
  alVar33[0] = alVar33[1];
  alVar33[1] = b[1];
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  local_788 = extraout_XMM0_Qa;
  uStack_780 = extraout_XMM0_Qb;
  abs_diff(a_00,alVar33);
  local_5c8 = (byte)local_788;
  bStack_5c7 = (byte)((ulong)local_788 >> 8);
  bStack_5c6 = (byte)((ulong)local_788 >> 0x10);
  bStack_5c5 = (byte)((ulong)local_788 >> 0x18);
  bStack_5c4 = (byte)((ulong)local_788 >> 0x20);
  bStack_5c3 = (byte)((ulong)local_788 >> 0x28);
  bStack_5c2 = (byte)((ulong)local_788 >> 0x30);
  bStack_5c1 = (byte)((ulong)local_788 >> 0x38);
  bStack_5c0 = (byte)uStack_780;
  bStack_5bf = (byte)((ulong)uStack_780 >> 8);
  bStack_5be = (byte)((ulong)uStack_780 >> 0x10);
  bStack_5bd = (byte)((ulong)uStack_780 >> 0x18);
  bStack_5bc = (byte)((ulong)uStack_780 >> 0x20);
  bStack_5bb = (byte)((ulong)uStack_780 >> 0x28);
  bStack_5ba = (byte)((ulong)uStack_780 >> 0x30);
  bStack_5b9 = (byte)((ulong)uStack_780 >> 0x38);
  bVar24 = (local_5c8 < bStack_5c0) * bStack_5c0 | (local_5c8 >= bStack_5c0) * local_5c8;
  bVar28 = (bStack_5c7 < bStack_5bf) * bStack_5bf | (bStack_5c7 >= bStack_5bf) * bStack_5c7;
  bVar29 = (bStack_5c6 < bStack_5be) * bStack_5be | (bStack_5c6 >= bStack_5be) * bStack_5c6;
  bVar30 = (bStack_5c5 < bStack_5bd) * bStack_5bd | (bStack_5c5 >= bStack_5bd) * bStack_5c5;
  bVar31 = (bStack_5c4 < bStack_5bc) * bStack_5bc | (bStack_5c4 >= bStack_5bc) * bStack_5c4;
  uStack_760._2_1_ =
       (bStack_5c3 < bStack_5bb) * bStack_5bb | (bStack_5c3 >= bStack_5bb) * bStack_5c3;
  uStack_760._4_1_ =
       (bStack_5c2 < bStack_5ba) * bStack_5ba | (bStack_5c2 >= bStack_5ba) * bStack_5c2;
  uStack_760._6_1_ =
       (bStack_5c1 < bStack_5b9) * bStack_5b9 | (bStack_5c1 >= bStack_5b9) * bStack_5c1;
  local_788 = CONCAT17(uStack_760._6_1_,
                       CONCAT16(uStack_760._4_1_,
                                CONCAT15(uStack_760._2_1_,
                                         CONCAT14(bVar31,CONCAT13(bVar30,CONCAT12(bVar29,CONCAT11(
                                                  bVar28,bVar24)))))));
  local_698 = (char)local_778;
  cStack_697 = (char)((ulong)local_778 >> 8);
  cStack_696 = (char)((ulong)local_778 >> 0x10);
  cStack_695 = (char)((ulong)local_778 >> 0x18);
  cStack_694 = (char)((ulong)local_778 >> 0x20);
  cStack_693 = (char)((ulong)local_778 >> 0x28);
  cStack_692 = (char)((ulong)local_778 >> 0x30);
  cStack_691 = (char)((ulong)local_778 >> 0x38);
  local_768._0_2_ = CONCAT11(local_698,bVar24);
  local_768._0_3_ = CONCAT12(bVar28,(short)local_768);
  local_768._0_4_ = CONCAT13(cStack_697,(undefined3)local_768);
  local_768._0_5_ = CONCAT14(bVar29,(undefined4)local_768);
  local_768._0_6_ = CONCAT15(cStack_696,(undefined5)local_768);
  local_768._0_7_ = CONCAT16(bVar30,(undefined6)local_768);
  local_768 = CONCAT17(cStack_695,(undefined7)local_768);
  _local_768 = CONCAT18(bVar31,local_768);
  _local_768 = CONCAT19(cStack_694,_local_768);
  uStack_760._3_1_ = cStack_693;
  uStack_760._5_1_ = cStack_692;
  uStack_760._7_1_ = cStack_691;
  uVar1 = *local_6d8;
  uVar2 = local_6d8[1];
  sStack_4e6 = (short)((uint)(undefined4)local_768 >> 0x10);
  sStack_4e4 = (short)((uint6)(undefined6)local_768 >> 0x20);
  sStack_4e2 = (short)(local_768 >> 0x30);
  sStack_4e0 = (short)((unkuint10)_local_768 >> 0x40);
  sStack_4de = local_768._10_2_;
  sStack_4dc = local_768._12_2_;
  sStack_4da = local_768._14_2_;
  local_4f8 = (short)uVar1;
  sStack_4f6 = (short)((ulong)uVar1 >> 0x10);
  sStack_4f4 = (short)((ulong)uVar1 >> 0x20);
  sStack_4f2 = (short)((ulong)uVar1 >> 0x30);
  sStack_4f0 = (short)uVar2;
  sStack_4ee = (short)((ulong)uVar2 >> 0x10);
  sStack_4ec = (short)((ulong)uVar2 >> 0x20);
  sStack_4ea = (short)((ulong)uVar2 >> 0x30);
  local_768._0_4_ =
       CONCAT22(-(ushort)(sStack_4f6 < sStack_4e6),-(ushort)(local_4f8 < (short)local_768));
  local_768._0_6_ = CONCAT24(-(ushort)(sStack_4f4 < sStack_4e4),(undefined4)local_768);
  local_768 = CONCAT26(-(ushort)(sStack_4f2 < sStack_4e2),(undefined6)local_768);
  uStack_760._0_2_ = -(ushort)(sStack_4f0 < sStack_4e0);
  uStack_760._2_2_ = -(ushort)(sStack_4ee < sStack_4de);
  uStack_760._4_2_ = -(ushort)(sStack_4ec < sStack_4dc);
  uStack_760._6_2_ = -(ushort)(sStack_4ea < sStack_4da);
  auVar8._8_8_ = uStack_760;
  auVar8._0_8_ = local_768;
  auVar25._8_8_ = uStack_760;
  auVar25._0_8_ = local_768;
  auVar25 = packsswb(auVar8,auVar25);
  auVar27._8_8_ = extraout_XMM0_Qb_00;
  auVar27._0_8_ = extraout_XMM0_Qa_00;
  auVar26._8_8_ = extraout_XMM0_Qb_00;
  auVar26._0_8_ = extraout_XMM0_Qa_00;
  auVar26 = paddusb(auVar27,auVar26);
  bStack_500 = (byte)extraout_XMM0_Qb_00;
  bStack_4ff = (byte)(extraout_XMM0_Qb_00 >> 8);
  bStack_4fe = (byte)(extraout_XMM0_Qb_00 >> 0x10);
  bStack_4fc = (byte)(extraout_XMM0_Qb_00 >> 0x20);
  bStack_4fb = (byte)(extraout_XMM0_Qb_00 >> 0x28);
  bStack_4fa = (byte)(extraout_XMM0_Qb_00 >> 0x30);
  bStack_4f9 = (byte)(extraout_XMM0_Qb_00 >> 0x38);
  local_748._0_4_ = (uint)bStack_4ff << 0x18;
  iVar22 = (int)local_748;
  local_748._0_6_ = (uint6)bStack_4fe << 0x28;
  iVar23 = (int6)local_748;
  local_748 = (extraout_XMM0_Qb_00 >> 0x18) << 0x38;
  uVar32 = (ulong)local_748 >> 0x39;
  local_748._0_4_ = CONCAT22((ushort)((uint)iVar22 >> 0x19),(ushort)(bStack_500 >> 1));
  local_748._0_6_ = CONCAT24((ushort)((uint6)iVar23 >> 0x29),(int)local_748);
  local_748 = CONCAT26((ushort)uVar32,(int6)local_748);
  uStack_740._0_2_ = (ushort)((uint3)((uint3)bStack_4fc << 0x10) >> 0x11);
  uStack_740._2_2_ = (ushort)(((uint5)bStack_4fb << 0x20) >> 0x21);
  uStack_740._4_2_ = (ushort)(((uint7)bStack_4fa << 0x30) >> 0x31);
  uStack_740._6_2_ = (ushort)((uint3)((uint3)bStack_4f9 << 0x10) >> 0x11);
  auVar7._8_8_ = uStack_740;
  auVar7._0_8_ = local_748;
  auVar6._8_8_ = uStack_740;
  auVar6._0_8_ = local_748;
  auVar27 = packsswb(auVar7,auVar6);
  auVar26 = paddusb(auVar26,auVar27);
  local_758 = auVar26._0_8_;
  auVar5._8_8_ = local_788;
  auVar5._0_8_ = local_758;
  auVar26 = psubusb(auVar5,*local_6d0);
  local_5e8 = auVar26[0];
  cStack_5e7 = auVar26[1];
  cStack_5e6 = auVar26[2];
  cStack_5e5 = auVar26[3];
  cStack_5e4 = auVar26[4];
  cStack_5e3 = auVar26[5];
  cStack_5e2 = auVar26[6];
  cStack_5e1 = auVar26[7];
  cStack_5e0 = auVar26[8];
  cStack_5df = auVar26[9];
  cStack_5de = auVar26[10];
  cStack_5dd = auVar26[0xb];
  cStack_5dc = auVar26[0xc];
  cStack_5db = auVar26[0xd];
  cStack_5da = auVar26[0xe];
  cStack_5d9 = auVar26[0xf];
  cStack_5f0 = (char)uStack_770;
  cStack_5ef = (char)((ulong)uStack_770 >> 8);
  cStack_5ee = (char)((ulong)uStack_770 >> 0x10);
  cStack_5ed = (char)((ulong)uStack_770 >> 0x18);
  cStack_5ec = (char)((ulong)uStack_770 >> 0x20);
  cStack_5eb = (char)((ulong)uStack_770 >> 0x28);
  cStack_5ea = (char)((ulong)uStack_770 >> 0x30);
  cStack_5e9 = (char)((ulong)uStack_770 >> 0x38);
  local_758._0_2_ = CONCAT11(-(cStack_5e7 == cStack_697),-(local_5e8 == local_698));
  local_758._0_3_ = CONCAT12(-(cStack_5e6 == cStack_696),(undefined2)local_758);
  local_758._0_4_ = CONCAT13(-(cStack_5e5 == cStack_695),(undefined3)local_758);
  local_758._0_5_ = CONCAT14(-(cStack_5e4 == cStack_694),(undefined4)local_758);
  local_758._0_6_ = CONCAT15(-(cStack_5e3 == cStack_693),(undefined5)local_758);
  local_758._0_7_ = CONCAT16(-(cStack_5e2 == cStack_692),(undefined6)local_758);
  local_758 = CONCAT17(-(cStack_5e1 == cStack_691),(undefined7)local_758);
  uStack_750._0_1_ = -(cStack_5e0 == cStack_5f0);
  uStack_750._1_1_ = -(cStack_5df == cStack_5ef);
  uStack_750._2_1_ = -(cStack_5de == cStack_5ee);
  uStack_750._3_1_ = -(cStack_5dd == cStack_5ed);
  uStack_750._4_1_ = -(cStack_5dc == cStack_5ec);
  uStack_750._5_1_ = -(cStack_5db == cStack_5eb);
  uStack_750._6_1_ = -(cStack_5da == cStack_5ea);
  uStack_750._7_1_ = -(cStack_5d9 == cStack_5e9);
  local_3e8 = local_6e8;
  local_408 = 0x8080808080808080;
  uStack_400 = 0x8080808080808080;
  uVar32 = CONCAT44(uStack_71c,uStack_720) ^ 0x8080808080808080;
  auVar14._8_8_ = uStack_710 ^ 0x8080808080808080;
  auVar14._0_8_ = local_718 ^ 0x8080808080808080;
  auVar13._8_8_ = uVar32;
  auVar13._0_8_ = local_728 ^ 0x8080808080808080;
  auVar26 = psubsb(auVar14,auVar13);
  uStack_430 = auVar26._8_8_;
  local_768 = auVar25._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uStack_430 & local_768;
  auVar27 = psubsb(auVar12,auVar26);
  auVar27 = psubsb(auVar27,auVar26);
  auVar26 = psubsb(auVar27,auVar26);
  local_418 = auVar26._0_8_;
  local_418 = local_418 & local_758 & uStack_750;
  auVar18._8_8_ = local_418;
  auVar18._0_8_ = local_418;
  auVar17._8_8_ = 0x303030303030303;
  auVar17._0_8_ = 0x404040404040404;
  auVar26 = paddsb(auVar18,auVar17);
  uStack_110 = auVar26[8];
  uStack_10f = auVar26[9];
  uStack_10e = auVar26[10];
  uStack_10d = auVar26[0xb];
  uStack_10c = auVar26[0xc];
  uStack_10b = auVar26[0xd];
  uStack_10a = auVar26[0xe];
  uStack_109 = auVar26[0xf];
  local_418._0_2_ = CONCAT11(uStack_110,uStack_110);
  local_418._0_3_ = CONCAT12(uStack_10f,(undefined2)local_418);
  local_418._0_4_ = CONCAT13(uStack_10f,(undefined3)local_418);
  local_418._0_5_ = CONCAT14(uStack_10e,(undefined4)local_418);
  local_418._0_6_ = CONCAT15(uStack_10e,(undefined5)local_418);
  local_418._0_7_ = CONCAT16(uStack_10d,(undefined6)local_418);
  local_418 = CONCAT17(uStack_10d,(undefined7)local_418);
  uStack_410._0_1_ = uStack_10c;
  uStack_410._1_1_ = uStack_10c;
  uStack_410._2_1_ = uStack_10b;
  uStack_410._3_1_ = uStack_10b;
  uStack_410._4_1_ = uStack_10a;
  uStack_410._5_1_ = uStack_10a;
  uStack_410._6_1_ = uStack_109;
  uStack_410._7_1_ = uStack_109;
  local_388 = auVar26[0];
  uStack_387 = auVar26[1];
  uStack_386 = auVar26[2];
  uStack_385 = auVar26[3];
  uStack_384 = auVar26[4];
  uStack_383 = auVar26[5];
  uStack_382 = auVar26[6];
  uStack_381 = auVar26[7];
  local_428._0_2_ = CONCAT11(local_388,local_388);
  local_428._0_3_ = CONCAT12(uStack_387,(undefined2)local_428);
  local_428._0_4_ = CONCAT13(uStack_387,(undefined3)local_428);
  local_428._0_5_ = CONCAT14(uStack_386,(undefined4)local_428);
  local_428._0_6_ = CONCAT15(uStack_386,(undefined5)local_428);
  local_428._0_7_ = CONCAT16(uStack_385,(undefined6)local_428);
  local_428 = CONCAT17(uStack_385,(undefined7)local_428);
  uStack_420._0_1_ = uStack_384;
  uStack_420._1_1_ = uStack_384;
  uStack_420._2_1_ = uStack_383;
  uStack_420._3_1_ = uStack_383;
  uStack_420._4_1_ = uStack_382;
  uStack_420._5_1_ = uStack_382;
  uStack_420._6_1_ = uStack_381;
  uStack_420._7_1_ = uStack_381;
  auVar21._8_8_ = uStack_420;
  auVar21._0_8_ = local_428;
  auVar26 = psraw(auVar21,ZEXT416(0xb));
  auVar20._8_8_ = uStack_410;
  auVar20._0_8_ = local_418;
  auVar27 = psraw(auVar20,ZEXT416(0xb));
  auVar26 = packsswb(auVar26,auVar27);
  local_428 = auVar26._0_8_;
  auVar11._8_8_ = 0xffffffffffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  auVar27 = psubsb(auVar26,auVar11);
  local_3a8 = auVar27[0];
  uStack_3a7 = auVar27[1];
  uStack_3a6 = auVar27[2];
  uStack_3a5 = auVar27[3];
  uStack_3a4 = auVar27[4];
  uStack_3a3 = auVar27[5];
  uStack_3a2 = auVar27[6];
  uStack_3a1 = auVar27[7];
  local_418._0_2_ = CONCAT11(local_3a8,local_3a8);
  local_418._0_3_ = CONCAT12(uStack_3a7,(undefined2)local_418);
  local_418._0_4_ = CONCAT13(uStack_3a7,(undefined3)local_418);
  local_418._0_5_ = CONCAT14(uStack_3a6,(undefined4)local_418);
  local_418._0_6_ = CONCAT15(uStack_3a6,(undefined5)local_418);
  local_418._0_7_ = CONCAT16(uStack_3a5,(undefined6)local_418);
  local_418 = CONCAT17(uStack_3a5,(undefined7)local_418);
  uStack_410._0_1_ = uStack_3a4;
  uStack_410._1_1_ = uStack_3a4;
  uStack_410._2_1_ = uStack_3a3;
  uStack_410._3_1_ = uStack_3a3;
  uStack_410._4_1_ = uStack_3a2;
  uStack_410._5_1_ = uStack_3a2;
  uStack_410._6_1_ = uStack_3a1;
  uStack_410._7_1_ = uStack_3a1;
  auVar19._8_8_ = uStack_410;
  auVar19._0_8_ = local_418;
  auVar27 = psraw(auVar19,ZEXT416(9));
  auVar27 = packsswb(auVar27,auVar27);
  local_418 = auVar27._0_8_;
  uStack_410._4_4_ = ~auVar25._12_4_ & auVar27._12_4_;
  uStack_420._4_4_ = auVar26._12_4_;
  local_458 = CONCAT44(uStack_410._4_4_,uStack_20);
  auVar10._8_8_ = uVar32;
  auVar10._0_8_ = local_458;
  auVar9._8_8_ = ~local_768 & local_418;
  auVar9._0_8_ = local_428;
  auVar26 = psubsb(auVar10,auVar9);
  auVar15._12_4_ = uStack_420._4_4_;
  auVar15._8_4_ = uStack_10;
  auVar16._8_8_ = uStack_710 ^ 0x8080808080808080;
  auVar16._0_8_ = local_718 ^ 0x8080808080808080;
  auVar15._0_8_ = local_468;
  local_448 = paddsb(auVar16,auVar15);
  local_458 = auVar26._0_8_;
  uStack_450 = auVar26._8_8_;
  *local_6e0 = local_458 ^ 0x8080808080808080;
  local_6e0[1] = uStack_450 ^ 0x8080808080808080;
  *local_3e8 = local_448._0_8_ ^ local_408;
  local_3e8[1] = local_448._8_8_ ^ uStack_400;
  *(ulong *)((long)local_9d0 - (long)local_9d4) = local_a58;
  *(undefined8 *)((long)local_9d0 - (long)(local_9d4 * 2)) = uStack_a50;
  *local_9d0 = local_a48;
  *(undefined8 *)((long)local_9d0 + (long)local_9d4) = uStack_a40;
  return;
}

Assistant:

void aom_lpf_horizontal_4_dual_sse2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0,
                                    const unsigned char *_blimit1,
                                    const unsigned char *_limit1,
                                    const unsigned char *_thresh1) {
  __m128i p1, p0, q0, q1;
  __m128i qs1qs0, ps1ps0;

  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));

  const __m128i zero = _mm_setzero_si128();
  const __m128i blimit =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_blimit0),
                         _mm_load_si128((const __m128i *)_blimit1));
  const __m128i limit =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_limit0),
                         _mm_load_si128((const __m128i *)_limit1));

  __m128i l = _mm_unpacklo_epi64(blimit, limit);

  __m128i thresh0 =
      _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)_thresh0), zero);

  __m128i thresh1 =
      _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)_thresh1), zero);

  __m128i t = _mm_unpacklo_epi64(thresh0, thresh1);

  lpf_internal_4_dual_sse2(&p1, &p0, &q0, &q1, &l, &t, &qs1qs0, &ps1ps0);

  _mm_storel_epi64((__m128i *)(s - 1 * p), ps1ps0);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(ps1ps0, 8));
  _mm_storel_epi64((__m128i *)(s + 0 * p), qs1qs0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(qs1qs0, 8));
}